

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::DocTestReporter::report(DocTestReporter *this,string *received,string *approved)

{
  code *pcVar1;
  byte extraout_AL;
  undefined1 uVar2;
  Enum EVar3;
  String *in_RDX;
  double __x;
  Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  EVar4;
  ResultBuilder DOCTEST_RB;
  string approvedText;
  string receivedText;
  string *in_stack_00000278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *operand;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  ExpressionDecomposer local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  Enum local_138;
  char *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  Enum in_stack_ffffffffffffff1c;
  ResultBuilder *in_stack_ffffffffffffff20;
  String *in_stack_ffffffffffffff30;
  string local_58 [32];
  string local_38 [56];
  
  FileUtils::readFileThrowIfMissing(in_stack_00000278);
  FileUtils::readFileThrowIfMissing(in_stack_00000278);
  doctest::String::String(in_RDX,in_stack_fffffffffffffe98);
  operand = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffef0;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff0c,(char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             in_stack_ffffffffffffff30);
  doctest::String::~String((String *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_144,DT_CHECK);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),operand);
  local_140 = EVar4.lhs;
  EVar3 = EVar4.m_at;
  local_138 = EVar3;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            ((Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10);
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar3,in_stack_fffffffffffffe90),(Result *)operand);
  doctest::detail::Result::~Result((Result *)0x142d16);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xffffffffffffff08,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)
               CONCAT44(EVar3,CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffe90)));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x142e38);
    ::std::__cxx11::string::~string(local_58);
    ::std::__cxx11::string::~string(local_38);
    return true;
  }
  pcVar1 = (code *)swi(3);
  uVar2 = (*pcVar1)();
  return (bool)uVar2;
}

Assistant:

bool DocTestReporter::report(std::string received, std::string approved) const
    {
        auto receivedText = FileUtils::readFileThrowIfMissing(received);
        auto approvedText = FileUtils::readFileThrowIfMissing(approved);
        CHECK(receivedText == approvedText);
        return true;
    }